

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-emit.c
# Opt level: O2

void fy_emit_vprintf(fy_emitter *emit,fy_emitter_write_type type,char *fmt,__va_list_tag *ap)

{
  long lVar1;
  uint uVar2;
  int len;
  char *__s;
  undefined8 uStack_50;
  undefined8 uStack_48;
  va_list ap2;
  
  ap2[0].overflow_arg_area = ap->reg_save_area;
  uStack_48._0_4_ = ap->gp_offset;
  uStack_48._4_4_ = ap->fp_offset;
  ap2[0]._0_8_ = ap->overflow_arg_area;
  uStack_50 = 0x123d4c;
  uVar2 = vsnprintf((char *)0x0,0,fmt,ap);
  if (-1 < (int)uVar2) {
    lVar1 = -((ulong)uVar2 + 0x10 & 0xfffffffffffffff0);
    __s = (char *)((long)ap2 + lVar1 + -8);
    *(undefined8 *)((long)&uStack_50 + lVar1) = 0x123d76;
    len = vsnprintf(__s,(ulong)uVar2 + 1,fmt,&uStack_48);
    if (-1 < len) {
      *(undefined8 *)((long)&uStack_50 + lVar1) = 0x123d89;
      fy_emit_write(emit,type,__s,len);
    }
  }
  return;
}

Assistant:

void fy_emit_vprintf(struct fy_emitter *emit, enum fy_emitter_write_type type, const char *fmt, va_list ap) {
    char *str;
    int size;
    va_list ap2;

    va_copy(ap2, ap);

    size = vsnprintf(NULL, 0, fmt, ap);
    if (size < 0)
        return;

    str = alloca(size + 1);
    size = vsnprintf(str, size + 1, fmt, ap2);
    if (size < 0)
        return;

    fy_emit_write(emit, type, str, size);
}